

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O0

bool __thiscall flatbuffers::GoGRPCGenerator::generate(GoGRPCGenerator *this)

{
  Namespace *this_00;
  int iVar1;
  bool bVar2;
  int iVar3;
  const_reference ppSVar4;
  pointer file_00;
  char *name;
  Namespace *ns;
  Parameters *in_R8;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined1 local_160 [8];
  string filename;
  string output;
  string local_118;
  string local_f8;
  string local_d8;
  value_type local_b8;
  Definition *def;
  unique_ptr<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
  service;
  int i;
  undefined1 local_98 [8];
  Parameters p;
  FlatBufFile file;
  GoGRPCGenerator *this_local;
  
  FlatBufFile::FlatBufFile
            ((FlatBufFile *)((long)&p.service_prefix.field_2 + 8),this->parser_,this->file_name_,
             kLanguageGo);
  grpc_go_generator::Parameters::Parameters((Parameters *)local_98);
  std::__cxx11::string::operator=((string *)local_98,"flatbuffers.Builder");
  for (service._M_t.
       super___uniq_ptr_impl<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
       ._M_t.
       super__Tuple_impl<0UL,_const_grpc_generator::Service_*,_std::default_delete<const_grpc_generator::Service>_>
       .super__Head_base<0UL,_const_grpc_generator::Service_*,_false>._M_head_impl._0_4_ = 0;
      iVar1 = (int)service._M_t.
                   super___uniq_ptr_impl<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_const_grpc_generator::Service_*,_std::default_delete<const_grpc_generator::Service>_>
                   .super__Head_base<0UL,_const_grpc_generator::Service_*,_false>._M_head_impl,
      iVar3 = FlatBufFile::service_count((FlatBufFile *)((long)&p.service_prefix.field_2 + 8)),
      iVar1 < iVar3;
      service._M_t.
      super___uniq_ptr_impl<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_grpc_generator::Service_*,_std::default_delete<const_grpc_generator::Service>_>
      .super__Head_base<0UL,_const_grpc_generator::Service_*,_false>._M_head_impl._0_4_ =
           (int)service._M_t.
                super___uniq_ptr_impl<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
                ._M_t.
                super__Tuple_impl<0UL,_const_grpc_generator::Service_*,_std::default_delete<const_grpc_generator::Service>_>
                .super__Head_base<0UL,_const_grpc_generator::Service_*,_false>._M_head_impl + 1) {
    FlatBufFile::service((FlatBufFile *)&def,(int)&p + 0x58);
    ppSVar4 = std::vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>::
              operator[](&(this->parser_->services_).vec,
                         (long)(int)service._M_t.
                                    super___uniq_ptr_impl<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_const_grpc_generator::Service_*,_std::default_delete<const_grpc_generator::Service>_>
                                    .super__Head_base<0UL,_const_grpc_generator::Service_*,_false>.
                                    _M_head_impl);
    local_b8 = *ppSVar4;
    BaseGenerator::LastNamespacePart_abi_cxx11_
              (&local_d8,(BaseGenerator *)(local_b8->super_Definition).defined_namespace,ns);
    std::__cxx11::string::operator=
              ((string *)(p.custom_method_io_type.field_2._M_local_buf + 8),(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    this_00 = (local_b8->super_Definition).defined_namespace;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"",(allocator<char> *)(output.field_2._M_local_buf + 0xf));
    Namespace::GetFullyQualifiedName(&local_f8,this_00,&local_118,1000);
    std::__cxx11::string::operator=
              ((string *)(p.package_name.field_2._M_local_buf + 8),(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)(output.field_2._M_local_buf + 0xf));
    file_00 = std::
              unique_ptr<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
              ::get((unique_ptr<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
                     *)&def);
    grpc_go_generator::GenerateServiceSource_abi_cxx11_
              ((string *)((long)&filename.field_2 + 8),
               (grpc_go_generator *)(p.service_prefix.field_2._M_local_buf + 8),(File *)file_00,
               (Service *)local_98,in_R8);
    BaseGenerator::NamespaceDir_abi_cxx11_
              (&local_1a0,&this->super_BaseGenerator,(local_b8->super_Definition).defined_namespace,
               false);
    std::operator+(&local_180,&local_1a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                   &local_180,"_grpc.go");
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_1a0);
    name = (char *)std::__cxx11::string::c_str();
    bVar2 = SaveFile(name,(string *)((long)&filename.field_2 + 8),false);
    if (!bVar2) {
      this_local._7_1_ = 0;
    }
    std::__cxx11::string::~string((string *)local_160);
    std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
    std::
    unique_ptr<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>::
    ~unique_ptr((unique_ptr<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
                 *)&def);
    if (!bVar2) goto LAB_00356e3d;
  }
  this_local._7_1_ = 1;
LAB_00356e3d:
  grpc_go_generator::Parameters::~Parameters((Parameters *)local_98);
  FlatBufFile::~FlatBufFile((FlatBufFile *)((long)&p.service_prefix.field_2 + 8));
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool generate() {
    FlatBufFile file(parser_, file_name_, FlatBufFile::kLanguageGo);
    grpc_go_generator::Parameters p;
    p.custom_method_io_type = "flatbuffers.Builder";
    for (int i = 0; i < file.service_count(); i++) {
      auto service = file.service(i);
      const Definition *def = parser_.services_.vec[i];
      p.package_name = LastNamespacePart(*(def->defined_namespace));
      p.service_prefix =
          def->defined_namespace->GetFullyQualifiedName("");  // file.package();
      std::string output =
          grpc_go_generator::GenerateServiceSource(&file, service.get(), &p);
      std::string filename =
          NamespaceDir(*def->defined_namespace) + def->name + "_grpc.go";
      if (!flatbuffers::SaveFile(filename.c_str(), output, false)) return false;
    }
    return true;
  }